

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.c
# Opt level: O2

void h2o_cache_delete(h2o_cache_t *cache,uint64_t now,h2o_iovec_t key,h2o_cache_hashcode_t keyhash)

{
  kh_cache_t *h;
  khint_t iter;
  h2o_cache_ref_t local_88;
  
  if (keyhash == 0) {
    keyhash = h2o_cache_calchash(key.base,key.len);
  }
  local_88.key.base = key.base;
  local_88.key.len = key.len;
  local_88.keyhash = keyhash;
  lock_cache(cache);
  purge(cache,now);
  h = cache->table;
  iter = kh_get_cache(h,&local_88);
  if (iter != h->n_buckets) {
    erase_ref(cache,iter,0);
  }
  unlock_cache(cache);
  return;
}

Assistant:

void h2o_cache_delete(h2o_cache_t *cache, uint64_t now, h2o_iovec_t key, h2o_cache_hashcode_t keyhash)
{
    h2o_cache_ref_t search_key;
    khiter_t iter;

    if (keyhash == 0)
        keyhash = h2o_cache_calchash(key.base, key.len);
    search_key.key = key;
    search_key.keyhash = keyhash;

    lock_cache(cache);

    purge(cache, now);

    if ((iter = kh_get(cache, cache->table, &search_key)) != kh_end(cache->table))
        erase_ref(cache, iter, 0);

    unlock_cache(cache);
}